

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cc
# Opt level: O2

void __thiscall hrvo::KdTree::build(KdTree *this)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  ulong local_50 [7];
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->agents_,
             (long)(this->simulator_->agents_).
                   super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->simulator_->agents_).
                   super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  local_50[0] = (long)(this->agents_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->agents_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
  while( true ) {
    lVar3 = (long)(this->simulator_->agents_).
                  super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->simulator_->agents_).
                  super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if ((ulong)(lVar3 >> 3) <= local_50[0]) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->agents_,local_50);
    local_50[0] = local_50[0] + 1;
  }
  local_50[1] = 0;
  local_50[2] = 0;
  local_50[3] = 0;
  local_50[4] = 0;
  local_50[5] = 0;
  local_50[6] = 0;
  std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::resize
            (&this->nodes_,(lVar3 >> 2) - 1,(value_type)ZEXT1648(ZEXT816(0)));
  puVar1 = (this->agents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (this->agents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    buildRecursive(this,0,(long)puVar2 - (long)puVar1 >> 3,0);
  }
  return;
}

Assistant:

void KdTree::build() {
  agents_.reserve(simulator_->agents_.size());

  for (std::size_t i = agents_.size(); i < simulator_->agents_.size(); ++i) {
    agents_.push_back(i);
  }

  nodes_.resize(2U * simulator_->agents_.size() - 1U);

  if (!agents_.empty()) {
    buildRecursive(0U, agents_.size(), 0U);
  }
}